

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_private.hh
# Opt level: O2

bool QPDF::Pipe::pipeStreamData
               (QPDF *qpdf,QPDFObjGen og,qpdf_offset_t offset,size_t length,QPDFObjectHandle *dict,
               bool is_root_metadata,Pipeline *pipeline,bool suppress_warnings,bool will_retry)

{
  bool bVar1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)dict);
  bVar1 = QPDF::pipeStreamData
                    (qpdf,og,offset,length,(QPDFObjectHandle *)&local_40,is_root_metadata,pipeline,
                     suppress_warnings,will_retry);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return bVar1;
}

Assistant:

static bool
    pipeStreamData(
        QPDF* qpdf,
        QPDFObjGen og,
        qpdf_offset_t offset,
        size_t length,
        QPDFObjectHandle dict,
        bool is_root_metadata,
        Pipeline* pipeline,
        bool suppress_warnings,
        bool will_retry)
    {
        return qpdf->pipeStreamData(
            og, offset, length, dict, is_root_metadata, pipeline, suppress_warnings, will_retry);
    }